

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

void __thiscall
google::protobuf::Reflection::Swap(Reflection *this,Message *message1,Message *message2)

{
  undefined4 uVar1;
  long lVar2;
  pointer pUVar3;
  pointer pUVar4;
  pointer pUVar5;
  ReflectionSchema *this_00;
  int iVar6;
  uint uVar7;
  uint32 uVar8;
  uint32 uVar9;
  LogMessage *pLVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Message *message2_00;
  UnknownFieldSet *pUVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  Reflection *extraout_RDX;
  Reflection *extraout_RDX_00;
  long lVar15;
  ulong uVar16;
  long lVar17;
  UnknownFieldSet *pUVar18;
  long lVar19;
  LogMessage local_128;
  LogMessage local_f0;
  LogMessage local_b8;
  LogMessage local_80;
  uint local_44;
  ReflectionSchema *local_40;
  LogFinisher local_31;
  undefined4 extraout_var_01;
  
  if (message1 != message2) {
    (*(message1->super_MessageLite)._vptr_MessageLite[0x13])(message1);
    if (extraout_RDX != this) {
      internal::LogMessage::LogMessage
                (&local_f0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/generated_message_reflection.cc"
                 ,0x255);
      pLVar10 = internal::LogMessage::operator<<
                          (&local_f0,"CHECK failed: (message1->GetReflection()) == (this): ");
      pLVar10 = internal::LogMessage::operator<<(pLVar10,"First argument to Swap() (of type \"");
      iVar6 = (*(message1->super_MessageLite)._vptr_MessageLite[0x13])(message1);
      pLVar10 = internal::LogMessage::operator<<
                          (pLVar10,*(string **)(CONCAT44(extraout_var,iVar6) + 8));
      pLVar10 = internal::LogMessage::operator<<
                          (pLVar10,
                           "\") is not compatible with this reflection object (which is for type \""
                          );
      pLVar10 = internal::LogMessage::operator<<(pLVar10,*(string **)(this->descriptor_ + 8));
      pLVar10 = internal::LogMessage::operator<<
                          (pLVar10,
                           "\").  Note that the exact same class is required; not just the same descriptor."
                          );
      internal::LogFinisher::operator=((LogFinisher *)&local_80,pLVar10);
      internal::LogMessage::~LogMessage(&local_f0);
    }
    (*(message2->super_MessageLite)._vptr_MessageLite[0x13])(message2);
    if (extraout_RDX_00 != this) {
      internal::LogMessage::LogMessage
                (&local_b8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/generated_message_reflection.cc"
                 ,0x25d);
      pLVar10 = internal::LogMessage::operator<<
                          (&local_b8,"CHECK failed: (message2->GetReflection()) == (this): ");
      pLVar10 = internal::LogMessage::operator<<(pLVar10,"Second argument to Swap() (of type \"");
      iVar6 = (*(message2->super_MessageLite)._vptr_MessageLite[0x13])(message2);
      pLVar10 = internal::LogMessage::operator<<
                          (pLVar10,*(string **)(CONCAT44(extraout_var_00,iVar6) + 8));
      pLVar10 = internal::LogMessage::operator<<
                          (pLVar10,
                           "\") is not compatible with this reflection object (which is for type \""
                          );
      pLVar10 = internal::LogMessage::operator<<(pLVar10,*(string **)(this->descriptor_ + 8));
      pLVar10 = internal::LogMessage::operator<<
                          (pLVar10,
                           "\").  Note that the exact same class is required; not just the same descriptor."
                          );
      internal::LogFinisher::operator=((LogFinisher *)&local_80,pLVar10);
      internal::LogMessage::~LogMessage(&local_b8);
    }
    uVar13 = (ulong)(uint)(this->schema_).metadata_offset_;
    uVar16 = *(ulong *)((long)&(message1->super_MessageLite)._vptr_MessageLite + uVar13);
    uVar14 = uVar16;
    if ((uVar16 & 1) != 0) {
      uVar14 = *(ulong *)(uVar16 & 0xfffffffffffffffe);
    }
    uVar13 = *(ulong *)((long)&(message2->super_MessageLite)._vptr_MessageLite + uVar13);
    if ((uVar13 & 1) != 0) {
      uVar13 = *(ulong *)(uVar13 & 0xfffffffffffffffe);
    }
    if (uVar14 == uVar13) {
      local_40 = &this->schema_;
      if ((this->schema_).has_bits_offset_ != -1) {
        if ((this->schema_).has_bits_offset_ == -1) {
          internal::LogMessage::LogMessage
                    (&local_128,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/generated_message_reflection.cc"
                     ,0x75b);
          pLVar10 = internal::LogMessage::operator<<
                              (&local_128,"CHECK failed: schema_.HasHasbits(): ");
          internal::LogFinisher::operator=((LogFinisher *)&local_80,pLVar10);
          internal::LogMessage::~LogMessage(&local_128);
        }
        uVar7 = internal::ReflectionSchema::HasBitsOffset(local_40);
        if ((this->schema_).has_bits_offset_ == -1) {
          local_44 = uVar7;
          internal::LogMessage::LogMessage
                    (&local_80,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/generated_message_reflection.cc"
                     ,0x75b);
          pLVar10 = internal::LogMessage::operator<<
                              (&local_80,"CHECK failed: schema_.HasHasbits(): ");
          internal::LogFinisher::operator=(&local_31,pLVar10);
          internal::LogMessage::~LogMessage(&local_80);
          uVar7 = local_44;
        }
        uVar8 = internal::ReflectionSchema::HasBitsOffset(local_40);
        lVar15 = (long)*(int *)(this->descriptor_ + 0x68);
        if (lVar15 < 1) {
          iVar6 = 0;
        }
        else {
          lVar19 = *(long *)(this->descriptor_ + 0x28);
          lVar17 = 0;
          iVar6 = 0;
          do {
            if (*(int *)(lVar19 + 0x3c + lVar17) != 3) {
              lVar2 = *(long *)(lVar19 + 0x58 + lVar17);
              if (lVar2 == 0) {
                uVar12 = 1;
              }
              else {
                uVar12 = 0;
                if (*(int *)(lVar2 + 0x18) == 1) {
                  uVar12 = (uint)*(byte *)(**(long **)(lVar2 + 0x20) + 0x41);
                }
              }
              iVar6 = iVar6 + uVar12;
            }
            lVar17 = lVar17 + 0x98;
          } while (lVar15 * 0x98 - lVar17 != 0);
        }
        if (0 < iVar6) {
          uVar12 = iVar6 + 0x1fU >> 5;
          uVar16 = 1;
          if (1 < uVar12) {
            uVar16 = (ulong)uVar12;
          }
          uVar14 = 0;
          do {
            uVar1 = *(undefined4 *)
                     ((long)&(message1->super_MessageLite)._vptr_MessageLite +
                     uVar14 * 4 + (ulong)uVar7);
            *(undefined4 *)
             ((long)&(message1->super_MessageLite)._vptr_MessageLite + uVar14 * 4 + (ulong)uVar7) =
                 *(undefined4 *)
                  ((long)&(message2->super_MessageLite)._vptr_MessageLite +
                  uVar14 * 4 + (ulong)uVar8);
            *(undefined4 *)
             ((long)&(message2->super_MessageLite)._vptr_MessageLite + uVar14 * 4 + (ulong)uVar8) =
                 uVar1;
            uVar14 = uVar14 + 1;
          } while (uVar16 != uVar14);
        }
      }
      if (-1 < this->last_non_weak_field_index_) {
        lVar19 = -1;
        lVar15 = 0;
        do {
          lVar17 = *(long *)(*(long *)(this->descriptor_ + 0x28) + 0x58 + lVar15);
          if ((lVar17 == 0) ||
             ((*(int *)(lVar17 + 0x18) == 1 &&
              (*(char *)(**(long **)(lVar17 + 0x20) + 0x41) == '\x01')))) {
            SwapField(this,message1,message2,
                      (FieldDescriptor *)(*(long *)(this->descriptor_ + 0x28) + lVar15));
          }
          lVar19 = lVar19 + 1;
          lVar15 = lVar15 + 0x98;
        } while (lVar19 < this->last_non_weak_field_index_);
      }
      iVar6 = *(int *)(this->descriptor_ + 0x6c);
      if (0 < (long)iVar6) {
        lVar15 = 0;
        do {
          lVar19 = *(long *)(this->descriptor_ + 0x30);
          if ((*(int *)(lVar19 + 0x18 + lVar15) != 1) ||
             (*(char *)(**(long **)(lVar19 + 0x20 + lVar15) + 0x41) == '\0')) {
            SwapOneofField(this,message1,message2,(OneofDescriptor *)(lVar19 + lVar15));
          }
          lVar15 = lVar15 + 0x30;
        } while ((long)iVar6 * 0x30 != lVar15);
      }
      this_00 = local_40;
      if ((this->schema_).extensions_offset_ != -1) {
        uVar8 = internal::ReflectionSchema::GetExtensionSetOffset(local_40);
        uVar9 = internal::ReflectionSchema::GetExtensionSetOffset(this_00);
        internal::ExtensionSet::Swap
                  ((ExtensionSet *)
                   ((long)&(message1->super_MessageLite)._vptr_MessageLite + (ulong)uVar8),
                   (ExtensionSet *)
                   ((long)&(message2->super_MessageLite)._vptr_MessageLite + (ulong)uVar9));
      }
      uVar14 = (ulong)(uint)(this->schema_).metadata_offset_;
      uVar16 = *(ulong *)((long)&(message1->super_MessageLite)._vptr_MessageLite + uVar14);
      if ((uVar16 & 1) == 0) {
        pUVar18 = internal::InternalMetadata::
                  mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>
                            ((InternalMetadata *)
                             ((long)&(message1->super_MessageLite)._vptr_MessageLite + uVar14));
      }
      else {
        pUVar18 = (UnknownFieldSet *)((uVar16 & 0xfffffffffffffffe) + 8);
      }
      uVar14 = (ulong)(uint)(this->schema_).metadata_offset_;
      uVar16 = *(ulong *)((long)&(message2->super_MessageLite)._vptr_MessageLite + uVar14);
      if ((uVar16 & 1) == 0) {
        pUVar11 = internal::InternalMetadata::
                  mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>
                            ((InternalMetadata *)
                             ((long)&(message2->super_MessageLite)._vptr_MessageLite + uVar14));
      }
      else {
        pUVar11 = (UnknownFieldSet *)((uVar16 & 0xfffffffffffffffe) + 8);
      }
      pUVar4 = (pUVar18->fields_).
               super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pUVar5 = (pUVar18->fields_).
               super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pUVar3 = (pUVar18->fields_).
               super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      (pUVar18->fields_).
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pUVar11->fields_).
           super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
           ._M_impl.super__Vector_impl_data._M_start;
      (pUVar18->fields_).
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pUVar11->fields_).
           super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      (pUVar18->fields_).
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pUVar11->fields_).
           super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      (pUVar11->fields_).
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      ._M_impl.super__Vector_impl_data._M_start = pUVar4;
      (pUVar11->fields_).
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      ._M_impl.super__Vector_impl_data._M_finish = pUVar5;
      (pUVar11->fields_).
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pUVar3;
    }
    else {
      if ((uVar16 & 1) != 0) {
        uVar16 = *(ulong *)(uVar16 & 0xfffffffffffffffe);
      }
      iVar6 = (*(message1->super_MessageLite)._vptr_MessageLite[4])(message1,uVar16);
      message2_00 = (Message *)CONCAT44(extraout_var_01,iVar6);
      (*(message2_00->super_MessageLite)._vptr_MessageLite[0xf])(message2_00,message2);
      (*(message2->super_MessageLite)._vptr_MessageLite[0xe])(message2,message1);
      Swap(this,message1,message2_00);
      uVar16 = *(ulong *)((long)&(message1->super_MessageLite)._vptr_MessageLite +
                         (ulong)(uint)(this->schema_).metadata_offset_);
      if ((uVar16 & 1) != 0) {
        uVar16 = *(ulong *)(uVar16 & 0xfffffffffffffffe);
      }
      if (uVar16 == 0) {
        (*(message2_00->super_MessageLite)._vptr_MessageLite[1])(message2_00);
      }
    }
  }
  return;
}

Assistant:

void Reflection::Swap(Message* message1, Message* message2) const {
  if (message1 == message2) return;

  // TODO(kenton):  Other Reflection methods should probably check this too.
  GOOGLE_CHECK_EQ(message1->GetReflection(), this)
      << "First argument to Swap() (of type \""
      << message1->GetDescriptor()->full_name()
      << "\") is not compatible with this reflection object (which is for type "
         "\""
      << descriptor_->full_name()
      << "\").  Note that the exact same class is required; not just the same "
         "descriptor.";
  GOOGLE_CHECK_EQ(message2->GetReflection(), this)
      << "Second argument to Swap() (of type \""
      << message2->GetDescriptor()->full_name()
      << "\") is not compatible with this reflection object (which is for type "
         "\""
      << descriptor_->full_name()
      << "\").  Note that the exact same class is required; not just the same "
         "descriptor.";

  // Check that both messages are in the same arena (or both on the heap). We
  // need to copy all data if not, due to ownership semantics.
  if (GetArena(message1) != GetArena(message2)) {
    // Slow copy path.
    // Use our arena as temp space, if available.
    Message* temp = message1->New(GetArena(message1));
    temp->MergeFrom(*message2);
    message2->CopyFrom(*message1);
    Swap(message1, temp);
    if (GetArena(message1) == nullptr) {
      delete temp;
    }
    return;
  }

  if (schema_.HasHasbits()) {
    uint32* has_bits1 = MutableHasBits(message1);
    uint32* has_bits2 = MutableHasBits(message2);

    int fields_with_has_bits = 0;
    for (int i = 0; i < descriptor_->field_count(); i++) {
      const FieldDescriptor* field = descriptor_->field(i);
      if (field->is_repeated() || schema_.InRealOneof(field)) {
        continue;
      }
      fields_with_has_bits++;
    }

    int has_bits_size = (fields_with_has_bits + 31) / 32;

    for (int i = 0; i < has_bits_size; i++) {
      std::swap(has_bits1[i], has_bits2[i]);
    }
  }

  for (int i = 0; i <= last_non_weak_field_index_; i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    if (schema_.InRealOneof(field)) continue;
    SwapField(message1, message2, field);
  }
  const int oneof_decl_count = descriptor_->oneof_decl_count();
  for (int i = 0; i < oneof_decl_count; i++) {
    const OneofDescriptor* oneof = descriptor_->oneof_decl(i);
    if (!oneof->is_synthetic()) {
      SwapOneofField(message1, message2, oneof);
    }
  }

  if (schema_.HasExtensionSet()) {
    MutableExtensionSet(message1)->Swap(MutableExtensionSet(message2));
  }

  MutableUnknownFields(message1)->Swap(MutableUnknownFields(message2));
}